

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashtbl.c
# Opt level: O0

void tommy_hashtable_foreach(tommy_hashtable *hashtable,tommy_foreach_func *func)

{
  undefined8 *puVar1;
  uint uVar2;
  long lVar3;
  tommy_hashtable_node **pptVar4;
  long in_FS_OFFSET;
  void *data;
  tommy_hashtable_node *node;
  tommy_count_t pos;
  tommy_hashtable_node **bucket;
  tommy_count_t bucket_max;
  tommy_foreach_func *func_local;
  tommy_hashtable *hashtable_local;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = hashtable->bucket_max;
  pptVar4 = hashtable->bucket;
  for (node._4_4_ = 0; node._4_4_ < uVar2; node._4_4_ = node._4_4_ + 1) {
    data = pptVar4[node._4_4_];
    while (data != (void *)0x0) {
      puVar1 = (undefined8 *)((long)data + 0x10);
      data = *data;
      (*func)((void *)*puVar1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void tommy_hashtable_foreach(tommy_hashtable* hashtable, tommy_foreach_func* func)
{
	tommy_count_t bucket_max = hashtable->bucket_max;
	tommy_hashtable_node** bucket = hashtable->bucket;
	tommy_count_t pos;

	for (pos = 0; pos < bucket_max; ++pos) {
		tommy_hashtable_node* node = bucket[pos];

		while (node) {
			void* data = node->data;
			node = node->next;
			func(data);
		}
	}
}